

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frontend_tester.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  FailStep FVar1;
  FailStep FVar2;
  ostream *poVar3;
  uint uVar4;
  long *local_298;
  ifstream file;
  long local_288 [2];
  byte abStack_278 [200];
  undefined8 auStack_1b0 [36];
  undefined1 local_90 [8];
  string contents;
  string fileName;
  string failStepString;
  
  uVar4 = 1;
  if (argc == 3) {
    fileName._M_dataplus._M_p = (pointer)0x0;
    fileName._M_string_length._0_1_ = 0;
    failStepString._M_dataplus._M_p = (pointer)0x0;
    failStepString._M_string_length._0_1_ = 0;
    contents.field_2._8_8_ = &fileName._M_string_length;
    fileName.field_2._8_8_ = &failStepString._M_string_length;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_298,argv[1],(allocator<char> *)local_90);
    std::__cxx11::string::operator=
              ((string *)(contents.field_2._M_local_buf + 8),(string *)&local_298);
    if (local_298 != local_288) {
      operator_delete(local_298,local_288[0] + 1);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_298,argv[2],(allocator<char> *)local_90);
    std::__cxx11::string::operator=
              ((string *)(fileName.field_2._M_local_buf + 8),(string *)&local_298);
    if (local_298 != local_288) {
      operator_delete(local_298,local_288[0] + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Running file: ",0xe);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)contents.field_2._8_8_,
                        (long)fileName._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(char *)fileName.field_2._8_8_,(long)failStepString._M_dataplus._M_p)
    ;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    FVar1 = failStepFromString((string *)((long)&fileName.field_2 + 8));
    std::ifstream::ifstream(&local_298,(string *)(contents.field_2._M_local_buf + 8),_S_in);
    if ((abStack_278[local_298[-3]] & 5) == 0) {
      local_90 = (undefined1  [8])&contents._M_string_length;
      std::__cxx11::string::_M_construct<std::istreambuf_iterator<char,std::char_traits<char>>>
                ((string *)local_90,*(undefined8 *)((long)auStack_1b0 + local_298[-3]),0xffffffff,0,
                 0xffffffff);
      FVar2 = run((string *)local_90);
      if (local_90 != (undefined1  [8])&contents._M_string_length) {
        operator_delete((void *)local_90,contents._M_string_length + 1);
      }
      uVar4 = (uint)(FVar2 != FVar1);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"file.fail is true, file may not exist! ",0x27);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(char *)contents.field_2._8_8_,
                          (long)fileName._M_dataplus._M_p);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,(char *)fileName.field_2._8_8_,
                          (long)failStepString._M_dataplus._M_p);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      uVar4 = 1;
      std::ostream::flush();
    }
    std::ifstream::~ifstream(&local_298);
    if ((size_type *)fileName.field_2._8_8_ != &failStepString._M_string_length) {
      operator_delete((void *)fileName.field_2._8_8_,
                      CONCAT71(failStepString._M_string_length._1_7_,
                               (undefined1)failStepString._M_string_length) + 1);
    }
    if ((size_type *)contents.field_2._8_8_ != &fileName._M_string_length) {
      operator_delete((void *)contents.field_2._8_8_,
                      CONCAT71(fileName._M_string_length._1_7_,(undefined1)fileName._M_string_length
                              ) + 1);
    }
  }
  return uVar4;
}

Assistant:

int main(int argc, char** argv) {

  if (argc != 3) {
    return 1;
  }

  std::string fileName;
  std::string failStepString;

  try {

    fileName = std::string{argv[1]};
    failStepString = std::string(argv[2]);

    std::cout << "Running file: " << fileName << " " << failStepString << std::endl;

    FailStep failStep = failStepFromString(failStepString);

    std::ifstream file{fileName};

    if (file.fail()) {
      std::cerr << "file.fail is true, file may not exist! " << fileName << " " << failStepString << std::endl;
      return 1;
    }

    std::string contents{std::istreambuf_iterator<char>(file), std::istreambuf_iterator<char>()};

    FailStep actualFailStep = run(contents);

    if (actualFailStep != failStep) {
      return 1;
    }

  } catch (...) {
    std::cerr << "Caught exception! " << fileName << " " << failStepString << std::endl;

    return 1;
  }

  return 0;
}